

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O1

void __thiscall
duckdb::ExportAggregateBindData::ExportAggregateBindData
          (ExportAggregateBindData *this,AggregateFunction *aggr_p,idx_t state_size_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  FunctionNullHandling FVar3;
  FunctionErrors FVar4;
  FunctionCollationHandling FVar5;
  AggregateDistinctDependent AVar6;
  long lVar7;
  aggregate_size_t *pp_Var8;
  aggregate_size_t *pp_Var9;
  byte bVar10;
  
  bVar10 = 0;
  (this->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__ExportAggregateBindData_019b8d68;
  SimpleFunction::SimpleFunction((SimpleFunction *)&this->aggr,(SimpleFunction *)aggr_p);
  (this->aggr).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01999660;
  LogicalType::LogicalType
            (&(this->aggr).super_BaseScalarFunction.return_type,
             &(aggr_p->super_BaseScalarFunction).return_type);
  FVar3 = (aggr_p->super_BaseScalarFunction).null_handling;
  FVar4 = (aggr_p->super_BaseScalarFunction).errors;
  FVar5 = (aggr_p->super_BaseScalarFunction).collation_handling;
  (this->aggr).super_BaseScalarFunction.stability = (aggr_p->super_BaseScalarFunction).stability;
  (this->aggr).super_BaseScalarFunction.null_handling = FVar3;
  (this->aggr).super_BaseScalarFunction.errors = FVar4;
  (this->aggr).super_BaseScalarFunction.collation_handling = FVar5;
  (this->aggr).super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0199c528;
  pp_Var8 = &aggr_p->state_size;
  pp_Var9 = &(this->aggr).state_size;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pp_Var9 = *pp_Var8;
    pp_Var8 = pp_Var8 + (ulong)bVar10 * -2 + 1;
    pp_Var9 = pp_Var9 + (ulong)bVar10 * -2 + 1;
  }
  AVar6 = aggr_p->distinct_dependent;
  (this->aggr).order_dependent = aggr_p->order_dependent;
  (this->aggr).distinct_dependent = AVar6;
  (this->aggr).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (aggr_p->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (aggr_p->function_info).internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (aggr_p->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->aggr).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->aggr).function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (aggr_p->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->state_size = state_size_p;
  return;
}

Assistant:

explicit ExportAggregateBindData(AggregateFunction aggr_p, idx_t state_size_p)
	    : aggr(std::move(aggr_p)), state_size(state_size_p) {
	}